

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

bool __thiscall
SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::
EditingIterator::Next(EditingIterator *this)

{
  NodeBase *pNVar1;
  SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  NodeBase *pNVar6;
  SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *pSVar7;
  
  pNVar6 = this->last;
  if (pNVar6 == (NodeBase *)0x0) {
    pNVar1 = (this->super_Iterator).current;
  }
  else {
    pNVar1 = (this->super_Iterator).current;
    if (pNVar6->next != pNVar1) goto LAB_00b1e53b;
  }
  pNVar6 = pNVar1;
  this->last = pNVar6;
  if (pNVar6 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pNVar6 = (this->super_Iterator).current;
  }
LAB_00b1e53b:
  pSVar2 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
            *)pNVar6->next;
  bVar4 = pSVar2 != (this->super_Iterator).list;
  pSVar7 = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
            *)0x0;
  if (bVar4) {
    pSVar7 = pSVar2;
  }
  (this->super_Iterator).current = &pSVar7->super_SListNodeBase<Memory::HeapAllocator>;
  return bVar4;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }